

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gen_cs_example.cc
# Opt level: O2

void GEN_CS::gen_cs_example_dm(multi_ex *examples,label *cs_labels)

{
  float fVar1;
  pointer ppeVar2;
  example *peVar3;
  wclass *pwVar4;
  uint32_t i;
  ulong uVar5;
  wclass local_30;
  
  v_array<COST_SENSITIVE::wclass>::clear(&cs_labels->costs);
  uVar5 = 0;
  while( true ) {
    ppeVar2 = (examples->super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl.
              super__Vector_impl_data._M_start;
    if ((ulong)((long)(examples->super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl.
                      super__Vector_impl_data._M_finish - (long)ppeVar2 >> 3) <= uVar5) break;
    peVar3 = ppeVar2[uVar5];
    pwVar4 = (peVar3->l).cs.costs._begin;
    local_30.x = 0.0;
    local_30.partial_prediction = 0.0;
    local_30.wap_value = 0.0;
    if ((long)(peVar3->l).cs.costs._end - (long)pwVar4 == 0x10) {
      fVar1 = pwVar4->x;
      if ((fVar1 != 3.4028235e+38) || (NAN(fVar1))) {
        local_30.x = fVar1;
      }
    }
    local_30.class_index = (uint32_t)uVar5;
    v_array<COST_SENSITIVE::wclass>::push_back(&cs_labels->costs,&local_30);
    uVar5 = (ulong)((uint32_t)uVar5 + 1);
  }
  return;
}

Assistant:

void gen_cs_example_dm(multi_ex& examples, COST_SENSITIVE::label& cs_labels)
{
  cs_labels.costs.clear();
  for (uint32_t i = 0; i < examples.size(); i++)
  {
    CB::label ld = examples[i]->l.cb;

    COST_SENSITIVE::wclass wc = {0., i, 0., 0.};
    if (ld.costs.size() == 1 && ld.costs[0].cost != FLT_MAX)
      wc.x = ld.costs[0].cost;
    cs_labels.costs.push_back(wc);
  }
}